

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O0

void __thiscall
MinVR::VRConcreteItemFactory<MinVR::VRInputDevice,_MinVR::VRFakeHandTrackerDevice>::
~VRConcreteItemFactory
          (VRConcreteItemFactory<MinVR::VRInputDevice,_MinVR::VRFakeHandTrackerDevice> *this)

{
  void *in_RDI;
  
  ~VRConcreteItemFactory
            ((VRConcreteItemFactory<MinVR::VRInputDevice,_MinVR::VRFakeHandTrackerDevice> *)0x12fff8
            );
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~VRConcreteItemFactory() {}